

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O2

void WebRtcIsac_Time2Spec
               (TransformTables *tables,double *inre1,double *inre2,int16_t *outreQ7,
               int16_t *outimQ7,FFTstr *fftstr_obj)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int dims [1];
  double tmpim [240];
  double tmpre [240];
  
  dims[0] = 0xf0;
  for (lVar3 = 0; lVar3 != 0x780; lVar3 = lVar3 + 8) {
    dVar7 = *(double *)((long)tables->costab1 + lVar3);
    dVar6 = *(double *)((long)tables->sintab1 + lVar3);
    dVar1 = *(double *)((long)inre1 + lVar3);
    dVar2 = *(double *)((long)inre2 + lVar3);
    *(double *)((long)tmpre + lVar3) = (dVar1 * dVar7 + dVar6 * dVar2) * 0.03227486121839514;
    *(double *)((long)tmpim + lVar3) = (dVar2 * dVar7 - dVar6 * dVar1) * 0.03227486121839514;
  }
  WebRtcIsac_Fftns(1,dims,tmpre,tmpim,-1,1.0,fftstr_obj);
  lVar3 = 0x1de;
  for (lVar5 = 0; lVar5 != 0xf0; lVar5 = lVar5 + 2) {
    dVar7 = *(double *)((long)tmpre + lVar5 * 4);
    dVar6 = *(double *)((long)tmpre + lVar3 * 4);
    dVar8 = dVar7 + dVar6;
    dVar6 = dVar6 - dVar7;
    dVar7 = *(double *)((long)tmpim + lVar5 * 4);
    dVar1 = *(double *)((long)tmpim + lVar3 * 4);
    dVar9 = dVar7 - dVar1;
    dVar7 = dVar7 + dVar1;
    dVar1 = *(double *)((long)tables->costab2 + lVar5 * 4);
    dVar2 = *(double *)((long)tables->sintab2 + lVar5 * 4);
    lVar4 = lrint((dVar8 * dVar1 - dVar2 * dVar9) * 128.0);
    *(short *)((long)outreQ7 + lVar5) = (short)lVar4;
    lVar4 = lrint((dVar8 * dVar2 + dVar9 * dVar1) * 128.0);
    *(short *)((long)outimQ7 + lVar5) = (short)lVar4;
    lVar4 = lrint((-dVar7 * dVar2 - dVar1 * dVar6) * 128.0);
    *(short *)((long)outreQ7 + lVar3) = (short)lVar4;
    lVar4 = lrint((dVar6 * dVar2 - dVar7 * dVar1) * 128.0);
    *(short *)((long)outimQ7 + lVar3) = (short)lVar4;
    lVar3 = lVar3 + -2;
  }
  return;
}

Assistant:

void WebRtcIsac_Time2Spec(const TransformTables* tables,
                          double* inre1,
                          double* inre2,
                          int16_t* outreQ7,
                          int16_t* outimQ7,
                          FFTstr* fftstr_obj) {
  int k;
  int dims[1];
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;
  double tmpre[FRAMESAMPLES_HALF], tmpim[FRAMESAMPLES_HALF];


  dims[0] = FRAMESAMPLES_HALF;


  /* Multiply with complex exponentials and combine into one complex vector */
  fact = 0.5 / sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    tmpre[k] = (inre1[k] * tmp1r + inre2[k] * tmp1i) * fact;
    tmpim[k] = (inre2[k] * tmp1r - inre1[k] * tmp1i) * fact;
  }


  /* Get DFT */
  WebRtcIsac_Fftns(1, dims, tmpre, tmpim, -1, 1.0, fftstr_obj);

  /* Use symmetry to separate into two complex vectors and center frames in time around zero */
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    xr = tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    yi = -tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    xi = tmpim[k] - tmpim[FRAMESAMPLES_HALF - 1 - k];
    yr = tmpim[k] + tmpim[FRAMESAMPLES_HALF - 1 - k];

    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    outreQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1r - xi * tmp1i) * 128.0);
    outimQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1i + xi * tmp1r) * 128.0);
    outreQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1i - yi * tmp1r) * 128.0);
    outimQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1r + yi * tmp1i) * 128.0);
  }
}